

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_transform.h
# Opt level: O0

triplet<unsigned_short> __thiscall
charls::transform_hp3<unsigned_short>::inverse::operator()(inverse *this,int v1,int v2,int v3)

{
  short sVar1;
  triplet<unsigned_short> tVar2;
  int g;
  int v3_local;
  int v2_local;
  int v1_local;
  inverse *this_local;
  triplet<unsigned_short> rgb;
  
  sVar1 = ((short)v1 + 0x4000) - (short)(v3 + v2 >> 2);
  triplet<unsigned_short>::triplet((triplet<unsigned_short> *)((long)&this_local + 2));
  tVar2.field_2.v3 = (short)v2 + -0x8000 + sVar1;
  tVar2.field_0 =
       (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)((short)v3 + -0x8000 + sVar1);
  tVar2.field_1 = (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)sVar1;
  return tVar2;
}

Assistant:

operator()(const int v1, const int v2, const int v3) const noexcept
        {
            const int g = static_cast<int>(v1 - ((v3 + v2) >> 2) + range_ / 4);
            triplet<T> rgb;
            rgb.R = static_cast<T>(v3 + g - range_ / 2); // new R
            rgb.G = static_cast<T>(g);                   // new G
            rgb.B = static_cast<T>(v2 + g - range_ / 2); // new B
            return rgb;
        }